

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void labeltype_cb(Fl_Choice *i,void *v)

{
  byte bVar1;
  Fl_Menu_Item *pFVar2;
  void *pvVar3;
  Fl_Widget_Type *this;
  bool bVar4;
  int iVar5;
  long lVar6;
  void **ppvVar7;
  Fl_Widget_Type *p;
  Fl_Type **ppFVar8;
  
  if ((char *)v == "LOAD") {
    bVar1 = (current_widget->o->label_).type;
    (i->super_Fl_Menu_).super_Fl_Widget.when_ = '\x04';
    ppvVar7 = &labeltypemenu[0].user_data_;
    for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
      if (*ppvVar7 == (void *)(ulong)bVar1) {
        Fl_Choice::value(i,(int)lVar6);
        return;
      }
      ppvVar7 = ppvVar7 + 7;
    }
  }
  else {
    pFVar2 = (i->super_Fl_Menu_).value_;
    if (pFVar2 == (Fl_Menu_Item *)0x0) {
      lVar6 = -1;
    }
    else {
      lVar6 = (long)(int)(((long)pFVar2 - (long)(i->super_Fl_Menu_).menu_) / 0x38);
    }
    pvVar3 = labeltypemenu[lVar6].user_data_;
    if (-1 < (int)pvVar3) {
      bVar4 = false;
      ppFVar8 = &Fl_Type::first;
      while (this = (Fl_Widget_Type *)*ppFVar8, this != (Fl_Widget_Type *)0x0) {
        if ((this->super_Fl_Type).selected != '\0') {
          iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this);
          if (iVar5 != 0) {
            (this->o->label_).type = (uchar)pvVar3;
            Fl_Widget_Type::redraw(this);
            bVar4 = true;
          }
        }
        ppFVar8 = &(this->super_Fl_Type).next;
      }
      if (bVar4) {
        set_modflag(1);
        return;
      }
    }
  }
  return;
}

Assistant:

void labeltype_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    int n;
    n = current_widget->o->labeltype();
    i->when(FL_WHEN_RELEASE);
    for (int j = 0; j < int(sizeof(labeltypemenu)/sizeof(*labeltypemenu)); j++)
      if (labeltypemenu[j].argument() == n) {i->value(j); break;}
  } else {
    int mod = 0;
    int m = i->value();
    int n = int(labeltypemenu[m].argument());
    if (n<0) return; // should not happen
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* p = (Fl_Widget_Type*)o;
	p->o->labeltype((Fl_Labeltype)n);
	p->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}